

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnhFrameER_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnhFrameER_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnhFrameER_Test *this)

{
  void *in_RDI;
  
  ~DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnhFrameER_Test
            ((DatarateTestSVC_BasicRateTargetingSVC3TL1SLDropAllEnhFrameER_Test *)0x7e88a8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL1SLDropAllEnhFrameER) {
  BasicRateTargetingSVC3TL1SLDropAllEnhFrameERTest();
}